

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O2

const_iterator __thiscall
frozen::
unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
::find<char[2]>(unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                *this,char (*key) [2])

{
  tables_type *this_00;
  bool bVar1;
  size_t sVar2;
  basic_string<char> *this_01;
  basic_string<char> other;
  
  this_00 = &this->tables_;
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<frozen::basic_string<char>>>::
          lookup<char[2],frozen::elsa<frozen::basic_string<char>>>
                    ((pmh_tables<8ul,frozen::elsa<frozen::basic_string<char>>> *)this_00,key,
                     (elsa<frozen::basic_string<char>_> *)this_00);
  if (sVar2 != 3) {
    this_01 = (this->keys_).data_ + sVar2;
    other.size_ = 1;
    other.data_ = *key;
    bVar1 = basic_string<char>::operator==(this_01,other);
    if (bVar1) {
      return this_01;
    }
  }
  return (const_iterator)this_00;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    auto const pos = tables_.lookup(key, hash_function());
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && key_eq()(*it, key))
      return it;
    else
      return keys_.end();
  }